

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O3

void __thiscall RX::~RX(RX *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->_compiled == true) {
    regfree((regex_t *)&this->_regex);
  }
  pcVar1 = (this->_pattern)._M_dataplus._M_p;
  paVar2 = &(this->_pattern).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

RX::~RX ()
{
  if (_compiled)
    regfree (&_regex);
}